

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ProcessInlineeEnd(BackwardPass *this,Instr *instr)

{
  ArgList *pAVar1;
  Type pIVar2;
  Opnd *pOVar3;
  _func_int **pp_Var4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar5;
  OpndKind OVar6;
  bool bVar7;
  int iVar8;
  InlineeFrameInfoValueType IVar9;
  uint uVar10;
  Func *curFunc;
  StackSym *pSVar11;
  undefined4 *puVar12;
  JITTimeFunctionBody *this_01;
  Func *pFVar13;
  InlineeFrameInfo *pIVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  Instr *pIVar18;
  Instr *pIVar19;
  anon_class_8_1_dda845c3 iterator;
  
  if (this->currentPrePassLoop == (Loop *)0x0) {
    if (this->tag == DeadStorePhase) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      bVar7 = JITTimeFunctionBody::UsesArgumentsObject(this_01);
      if ((bVar7) && (bVar7 = Func::IsStackArgsEnabled(instr->m_func), !bVar7)) {
        pFVar13 = instr->m_func;
        do {
          *(uint *)&pFVar13->field_0x240 = *(uint *)&pFVar13->field_0x240 & 0xfffff7fd;
          pFVar13->frameInfo = (InlineeFrameInfo *)0x0;
          pFVar13 = pFVar13->parentFunc;
        } while (pFVar13 != (Func *)0x0);
      }
      if ((instr->m_func->field_0x240 & 2) != 0) {
        pIVar14 = instr->m_func->frameInfo;
        if (pIVar14 == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2079,"(instr->m_func->frameInfo)","instr->m_func->frameInfo");
          if (!bVar7) goto LAB_003e4f2e;
          *puVar12 = 0;
          pIVar14 = instr->m_func->frameInfo;
        }
        pAVar1 = pIVar14->arguments;
        if (0 < (pAVar1->
                super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count) {
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          lVar16 = 0;
          lVar17 = 0;
          do {
            pIVar2 = (pAVar1->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            iVar8 = *(int *)((long)&pIVar2->type + lVar16);
            if (iVar8 == 1) {
              BVSparse<Memory::JitArenaAllocator>::Set
                        (this->currentBlock->upwardExposedUses,
                         *(BVIndex *)(*(long *)((long)&pIVar2->field_1 + lVar16) + 0x10));
              iVar8 = *(int *)((long)&pIVar2->type + lVar16);
            }
            if (iVar8 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                                 ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                                 "value.type != InlineeFrameInfoValueType_None");
              if (!bVar7) goto LAB_003e4f2e;
              *puVar12 = 0;
            }
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 0x18;
          } while (lVar17 < (pAVar1->
                            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                            ).count);
        }
        IVar9 = (pIVar14->function).type;
        if (IVar9 == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                             ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                             "function.type != InlineeFrameInfoValueType_None");
          if (!bVar7) goto LAB_003e4f2e;
          *puVar12 = 0;
          IVar9 = (pIVar14->function).type;
        }
        if (IVar9 == InlineeFrameInfoValueType_Sym) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentBlock->upwardExposedUses,
                     (((pIVar14->function).field_1.sym)->super_Sym).m_id);
          return;
        }
      }
    }
    else if (this->tag == BackwardPhase) {
      pSVar11 = IR::Opnd::GetStackSym(instr->m_src2);
      pIVar18 = (pSVar11->field_5).m_instrDef;
      if ((pIVar18 != (Instr *)0x0 & pSVar11->field_0x18) == 1) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar7) {
LAB_003e4f2e:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar12 = 0;
        pIVar18 = (pSVar11->field_5).m_instrDef;
      }
      do {
        if ((pIVar18->m_src2 == (Opnd *)0x0) ||
           (OVar6 = IR::Opnd::GetKind(pIVar18->m_src2), OVar6 != OpndKindSym)) {
LAB_003e4e40:
          pIVar19 = (Instr *)0x0;
        }
        else {
          pOVar3 = pIVar18->m_src2;
          OVar6 = IR::Opnd::GetKind(pOVar3);
          if (OVar6 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar7) goto LAB_003e4f2e;
            *puVar12 = 0;
          }
          pp_Var4 = pOVar3[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var4 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar7) goto LAB_003e4f2e;
            *puVar12 = 0;
          }
          uVar10 = *(uint *)(pp_Var4 + 3);
          uVar15 = uVar10 & 0x100000;
          if ((uVar15 != 0) && (*(short *)((long)pp_Var4 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar7) goto LAB_003e4f2e;
            *puVar12 = 0;
            uVar10 = *(uint *)(pp_Var4 + 3);
            uVar15 = uVar10 & 0x100000;
          }
          if (uVar15 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar7) goto LAB_003e4f2e;
            *puVar12 = 0;
            uVar10 = *(uint *)(pp_Var4 + 3);
          }
          if (((((uVar10 & 1) == 0) || (pp_Var4[5] == (_func_int *)0x0)) &&
              (bVar7 = Func::IsInPhase(instr->m_func,FGPeepsPhase), !bVar7)) &&
             (bVar7 = Func::IsInPhase(instr->m_func,FGBuildPhase), !bVar7)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar7) goto LAB_003e4f2e;
            *puVar12 = 0;
          }
          if (((ulong)pp_Var4[3] & 1) == 0) goto LAB_003e4e40;
          pIVar19 = (Instr *)pp_Var4[5];
        }
        if (pIVar18->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar18->m_opcode == StartCall) {
            if (pIVar19 == (Instr *)0x0) {
              return;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
            if (bVar7) {
              *puVar12 = 0;
              return;
            }
            goto LAB_003e4f2e;
          }
          OVar6 = IR::Opnd::GetKind(pIVar18->m_src1);
          if (OVar6 == OpndKindReg) {
            this_00 = this->currentBlock->upwardExposedUses;
            pOVar3 = pIVar18->m_src1;
            OVar6 = IR::Opnd::GetKind(pOVar3);
            if (OVar6 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar7) goto LAB_003e4f2e;
              *puVar12 = 0;
            }
            BVSparse<Memory::JitArenaAllocator>::Set(this_00,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2))
            ;
          }
        }
        pIVar18 = pIVar19;
      } while (pIVar19 != (Instr *)0x0);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessInlineeEnd(IR::Instr* instr)
{
    if (this->IsPrePass())
    {
        return;
    }
    if (this->tag == Js::BackwardPhase)
    {
        // Commenting out to allow for argument length and argument[constant] optimization
        // Will revisit in phase two
        /*if (!GlobOpt::DoInlineArgsOpt(instr->m_func))
        {
            return;
        }*/

        // This adds a use for function sym as part of InlineeStart & all the syms referenced by the args.
        // It ensure they do not get cleared from the copy prop sym map.
        instr->IterateArgInstrs([=](IR::Instr* argInstr){
            if (argInstr->GetSrc1()->IsRegOpnd())
            {
                this->currentBlock->upwardExposedUses->Set(argInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
            }
            return false;
        });
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        if (instr->m_func->GetJITFunctionBody()->UsesArgumentsObject() && !instr->m_func->IsStackArgsEnabled())
        {
            instr->m_func->DisableCanDoInlineArgOpt();
        }

        if (instr->m_func->m_hasInlineArgsOpt)
        {
            Assert(instr->m_func->frameInfo);
            instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
            {
                this->currentBlock->upwardExposedUses->Set(argSym->m_id);
            });
        }
    }
}